

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Barker.cpp
# Opt level: O3

void __thiscall AI::Barker::update(Barker *this,float dt)

{
  float fVar1;
  
  if ((this->barking == true) &&
     (fVar1 = this->timeRemaining - dt, this->timeRemaining = fVar1, fVar1 <= 0.0)) {
    this->barking = false;
    this->timeRemaining = 0.0;
  }
  return;
}

Assistant:

void Barker::update(float dt)
	{
		if (!barking)
		{
			return;
		}

		timeRemaining -= dt;

		if (timeRemaining <= 0.f)
		{
			barking = false;
			timeRemaining = 0.f;
		}
	}